

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFuzzyImageCompare.cpp
# Opt level: O3

deUint32 tcu::distSquaredToNeighbor<4>
                   (Random *rnd,deUint32 pixel,ConstPixelBufferAccess *surface,int x,int y)

{
  void *pvVar1;
  uint uVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  undefined4 uVar9;
  Random *pRVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  int d;
  uint uVar16;
  uint uVar17;
  long lVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  float fVar22;
  float fVar23;
  int iVar25;
  undefined1 auVar24 [16];
  float fVar26;
  float fVar27;
  
  iVar15 = (surface->m_pitch).m_data[1];
  uVar2 = *(uint *)((long)surface->m_data + (long)(x * 4) + (long)(iVar15 * y));
  uVar13 = pixel & 0xff;
  uVar14 = uVar13 - (uVar2 & 0xff);
  uVar12 = -uVar14;
  if (0 < (int)uVar14) {
    uVar12 = uVar14;
  }
  if (uVar12 < 5) {
    uVar12 = 4;
  }
  uVar16 = pixel >> 8 & 0xff;
  uVar17 = uVar16 - (uVar2 >> 8 & 0xff);
  uVar14 = -uVar17;
  if (0 < (int)uVar17) {
    uVar14 = uVar17;
  }
  if (uVar14 < 5) {
    uVar14 = 4;
  }
  uVar19 = pixel >> 0x10 & 0xff;
  uVar20 = uVar19 - (uVar2 >> 0x10 & 0xff);
  uVar17 = -uVar20;
  if (0 < (int)uVar20) {
    uVar17 = uVar20;
  }
  if (uVar17 < 5) {
    uVar17 = 4;
  }
  uVar20 = pixel >> 0x18;
  uVar7 = uVar20 - (uVar2 >> 0x18);
  uVar2 = -uVar7;
  if (0 < (int)uVar7) {
    uVar2 = uVar7;
  }
  if (uVar2 < 5) {
    uVar2 = 4;
  }
  uVar2 = (uVar2 - 4) * (uVar2 - 4) + (uVar12 - 4) * (uVar12 - 4) + (uVar14 - 4) * (uVar14 - 4) +
          (uVar17 - 4) * (uVar17 - 4);
  if (uVar2 == 0) {
LAB_00335b26:
    uVar2 = 0;
  }
  else {
    lVar18 = 0;
    do {
      iVar8 = distSquaredToNeighbor<4>::s_coords[lVar18][0] + x;
      if ((((-1 < iVar8) && (iVar8 < (surface->m_size).m_data[0])) &&
          (iVar5 = distSquaredToNeighbor<4>::s_coords[lVar18][1] + y, -1 < iVar5)) &&
         (iVar5 < (surface->m_size).m_data[1])) {
        uVar12 = *(uint *)((long)surface->m_data + (long)(iVar8 * 4) + (long)(iVar5 * iVar15));
        uVar17 = uVar13 - (uVar12 & 0xff);
        uVar14 = -uVar17;
        if (0 < (int)uVar17) {
          uVar14 = uVar17;
        }
        if (uVar14 < 5) {
          uVar14 = 4;
        }
        uVar7 = uVar16 - (uVar12 >> 8 & 0xff);
        uVar17 = -uVar7;
        if (0 < (int)uVar7) {
          uVar17 = uVar7;
        }
        if (uVar17 < 5) {
          uVar17 = 4;
        }
        uVar11 = uVar19 - (uVar12 >> 0x10 & 0xff);
        uVar7 = -uVar11;
        if (0 < (int)uVar11) {
          uVar7 = uVar11;
        }
        if (uVar7 < 5) {
          uVar7 = 4;
        }
        uVar11 = uVar20 - (uVar12 >> 0x18);
        uVar12 = -uVar11;
        if (0 < (int)uVar11) {
          uVar12 = uVar11;
        }
        if (uVar12 < 5) {
          uVar12 = 4;
        }
        uVar12 = (uVar12 - 4) * (uVar12 - 4) + (uVar14 - 4) * (uVar14 - 4) +
                 (uVar17 - 4) * (uVar17 - 4) + (uVar7 - 4) * (uVar7 - 4);
        if (uVar12 <= uVar2) {
          uVar2 = uVar12;
        }
        if (uVar2 == 0) goto LAB_00335b26;
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 != 8);
    iVar15 = 0;
    do {
      fVar22 = deRandom_getFloat(&rnd->m_rnd);
      pRVar10 = rnd;
      fVar23 = deRandom_getFloat(&rnd->m_rnd);
      uVar9 = SUB84(pRVar10,0);
      iVar6 = (surface->m_size).m_data[0] + -1;
      iVar21 = (surface->m_size).m_data[1] + -1;
      fVar26 = fVar23 + fVar23 + (float)y + -0.5 + -0.5;
      fVar27 = fVar22 + fVar22 + (float)x + -0.5 + -0.5;
      fVar22 = floorf(fVar26);
      fVar23 = floorf(fVar27);
      auVar24._0_4_ = (int)fVar22;
      iVar25 = (int)fVar23;
      iVar8 = iVar25 + 1;
      iVar5 = auVar24._0_4_ + 1;
      iVar4 = iVar25;
      if (iVar6 <= iVar25) {
        iVar4 = iVar6;
      }
      if (iVar8 < iVar6) {
        iVar6 = iVar8;
      }
      iVar6 = iVar6 << 2;
      auVar24._4_4_ = auVar24._0_4_;
      auVar24._8_4_ = iVar25;
      auVar24._12_4_ = iVar25;
      iVar25 = auVar24._0_4_;
      if (iVar21 <= auVar24._0_4_) {
        iVar25 = iVar21;
      }
      uVar12 = movmskpd(uVar9,auVar24);
      if ((uVar12 & 1) != 0) {
        iVar25 = 0;
      }
      if (iVar5 < iVar21) {
        iVar21 = iVar5;
      }
      if (iVar5 < 0) {
        iVar21 = 0;
      }
      iVar5 = (surface->m_pitch).m_data[1];
      pvVar1 = surface->m_data;
      iVar25 = iVar25 * iVar5;
      lVar18 = 0;
      if ((uVar12 & 2) == 0) {
        lVar18 = (long)(iVar4 << 2);
      }
      fVar26 = fVar26 - fVar22;
      fVar27 = fVar27 - fVar23;
      if (iVar8 < 0) {
        iVar6 = 0;
      }
      iVar21 = iVar21 * iVar5;
      iVar8 = 0;
      uVar12 = 0;
      do {
        bVar3 = (byte)iVar8;
        iVar5 = (int)((float)(*(uint *)((long)pvVar1 + (long)iVar6 + (long)iVar21) >> (bVar3 & 0x1f)
                             & 0xff) * fVar27 * fVar26 +
                      (float)(*(uint *)((long)pvVar1 + lVar18 + iVar21) >> (bVar3 & 0x1f) & 0xff) *
                      (1.0 - fVar27) * fVar26 +
                      (float)(*(uint *)((long)pvVar1 + lVar18 + iVar25) >> (bVar3 & 0x1f) & 0xff) *
                      (1.0 - fVar27) * (1.0 - fVar26) +
                      (float)(*(uint *)((long)pvVar1 + (long)iVar6 + (long)iVar25) >> (bVar3 & 0x1f)
                             & 0xff) * fVar27 * (1.0 - fVar26) + 0.5);
        if (0xfe < iVar5) {
          iVar5 = 0xff;
        }
        if (iVar5 < 1) {
          iVar5 = 0;
        }
        uVar12 = iVar5 << (bVar3 & 0x1f) | uVar12 & ~(0xff << (bVar3 & 0x1f));
        iVar8 = iVar8 + 8;
      } while (iVar8 != 0x20);
      uVar17 = uVar13 - (uVar12 & 0xff);
      uVar14 = -uVar17;
      if (0 < (int)uVar17) {
        uVar14 = uVar17;
      }
      if (uVar14 < 5) {
        uVar14 = 4;
      }
      uVar7 = uVar16 - (uVar12 >> 8 & 0xff);
      uVar17 = -uVar7;
      if (0 < (int)uVar7) {
        uVar17 = uVar7;
      }
      if (uVar17 < 5) {
        uVar17 = 4;
      }
      uVar11 = uVar19 - (uVar12 >> 0x10 & 0xff);
      uVar7 = -uVar11;
      if (0 < (int)uVar11) {
        uVar7 = uVar11;
      }
      if (uVar7 < 5) {
        uVar7 = 4;
      }
      uVar11 = uVar20 - (uVar12 >> 0x18);
      uVar12 = -uVar11;
      if (0 < (int)uVar11) {
        uVar12 = uVar11;
      }
      if (uVar12 < 5) {
        uVar12 = 4;
      }
      uVar12 = (uVar12 - 4) * (uVar12 - 4) + (uVar14 - 4) * (uVar14 - 4) +
               (uVar17 - 4) * (uVar17 - 4) + (uVar7 - 4) * (uVar7 - 4);
      if (uVar2 < uVar12) {
        uVar12 = uVar2;
      }
      uVar2 = uVar12;
      if (uVar2 == 0) goto LAB_00335b26;
      iVar15 = iVar15 + 1;
    } while (iVar15 != 0x20);
  }
  return uVar2;
}

Assistant:

static deUint32 distSquaredToNeighbor (de::Random& rnd, deUint32 pixel, const ConstPixelBufferAccess& surface, int x, int y)
{
	// (x, y) + (0, 0)
	deUint32	minDist		= colorDistSquared(pixel, readUnorm8<NumChannels>(surface, x, y));

	if (minDist == 0)
		return minDist;

	// Area around (x, y)
	static const int s_coords[][2] =
	{
		{-1, -1},
		{ 0, -1},
		{+1, -1},
		{-1,  0},
		{+1,  0},
		{-1, +1},
		{ 0, +1},
		{+1, +1}
	};

	for (int d = 0; d < (int)DE_LENGTH_OF_ARRAY(s_coords); d++)
	{
		int dx = x + s_coords[d][0];
		int dy = y + s_coords[d][1];

		if (!deInBounds32(dx, 0, surface.getWidth()) || !deInBounds32(dy, 0, surface.getHeight()))
			continue;

		minDist = de::min(minDist, colorDistSquared(pixel, readUnorm8<NumChannels>(surface, dx, dy)));
		if (minDist == 0)
			return minDist;
	}

	// Random bilinear-interpolated samples around (x, y)
	for (int s = 0; s < 32; s++)
	{
		float dx = (float)x + rnd.getFloat()*2.0f - 0.5f;
		float dy = (float)y + rnd.getFloat()*2.0f - 0.5f;

		deUint32 sample = bilinearSample<NumChannels>(surface, dx, dy);

		minDist = de::min(minDist, colorDistSquared(pixel, sample));
		if (minDist == 0)
			return minDist;
	}

	return minDist;
}